

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O0

int __thiscall dtlsopenssl::DtlsState::init(DtlsState *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  BIO *pBVar4;
  QHostAddress *in_RCX;
  QUdpSocket *in_RDX;
  quint16 in_R8W;
  DtlsState *in_R9;
  BIO *bio;
  QDtlsBasePrivate *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 local_1;
  undefined7 extraout_var;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->tlsContext);
  if (!bVar1) {
    bVar1 = initTls(in_R9,in_stack_ffffffffffffffc0);
    uVar3 = CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0017c5ac;
    }
  }
  this->udpSocket = in_RDX;
  setLinkMtu((DtlsState *)CONCAT26(in_R8W,in_stack_ffffffffffffffd0),(QDtlsBasePrivate *)in_R9);
  QByteArray::operator=(&this->dgram,(QByteArray *)in_R9);
  QHostAddress::operator=(&this->remoteAddress,in_RCX);
  this->remotePort = in_R8W;
  QSharedPointer<ssl_st>::data((QSharedPointer<ssl_st> *)0x17c58a);
  pBVar4 = q_SSL_get_rbio((SSL *)this);
  uVar2 = q_BIO_set_ex_data((BIO *)in_R9,(int)((ulong)pBVar4 >> 0x20),this);
  uVar3 = (ulong)uVar2;
  local_1 = 1;
LAB_0017c5ac:
  return (int)CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

bool DtlsState::init(QDtlsBasePrivate *dtlsBase, QUdpSocket *socket,
                     const QHostAddress &remote, quint16 port,
                     const QByteArray &receivedMessage)
{
    Q_ASSERT(dtlsBase);
    Q_ASSERT(socket);

    if (!tlsContext && !initTls(dtlsBase))
        return false;

    udpSocket = socket;

    setLinkMtu(dtlsBase);

    dgram = receivedMessage;
    remoteAddress = remote;
    remotePort = port;

    // SSL_get_rbio does not increment a reference count.
    BIO *bio = q_SSL_get_rbio(tlsConnection.data());
    Q_ASSERT(bio);
    q_BIO_set_app_data(bio, this);

    return true;
}